

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNames.c
# Opt level: O2

int Abc_NodeCompareCiCo(Abc_Ntk_t *pNtkOld,Abc_Ntk_t *pNtkNew)

{
  int iVar1;
  Abc_Obj_t *pAVar2;
  char *pcVar3;
  char *pcVar4;
  int iVar5;
  
  if (pNtkOld->vPis->nSize != pNtkNew->vPis->nSize) {
    return 0;
  }
  if (pNtkOld->vPos->nSize == pNtkNew->vPos->nSize) {
    if (pNtkOld->nObjCounts[8] != pNtkNew->nObjCounts[8]) {
      return 0;
    }
    iVar5 = 0;
    while (iVar5 < pNtkOld->vCis->nSize) {
      pAVar2 = Abc_NtkCi(pNtkOld,iVar5);
      pcVar3 = Abc_ObjName(pAVar2);
      pAVar2 = Abc_NtkCi(pNtkNew,iVar5);
      pcVar4 = Abc_ObjName(pAVar2);
      iVar1 = strcmp(pcVar3,pcVar4);
      iVar5 = iVar5 + 1;
      if (iVar1 != 0) {
        return 0;
      }
    }
    iVar5 = 0;
    do {
      if (pNtkOld->vCos->nSize <= iVar5) {
        return 1;
      }
      pAVar2 = Abc_NtkCo(pNtkOld,iVar5);
      pcVar3 = Abc_ObjName(pAVar2);
      pAVar2 = Abc_NtkCo(pNtkNew,iVar5);
      pcVar4 = Abc_ObjName(pAVar2);
      iVar1 = strcmp(pcVar3,pcVar4);
      iVar5 = iVar5 + 1;
    } while (iVar1 == 0);
    return 0;
  }
  return 0;
}

Assistant:

int Abc_NodeCompareCiCo( Abc_Ntk_t * pNtkOld, Abc_Ntk_t * pNtkNew )
{
    int i;
    if ( Abc_NtkPiNum(pNtkOld) != Abc_NtkPiNum(pNtkNew) )
        return 0;
    if ( Abc_NtkPoNum(pNtkOld) != Abc_NtkPoNum(pNtkNew) )
        return 0;
    if ( Abc_NtkLatchNum(pNtkOld) != Abc_NtkLatchNum(pNtkNew) )
        return 0;
    for ( i = 0; i < Abc_NtkCiNum(pNtkOld); i++ )
        if ( strcmp(Abc_ObjName(Abc_NtkCi(pNtkOld, i)), Abc_ObjName(Abc_NtkCi(pNtkNew, i))) )
            return 0;
    for ( i = 0; i < Abc_NtkCoNum(pNtkOld); i++ )
        if ( strcmp(Abc_ObjName(Abc_NtkCo(pNtkOld, i)), Abc_ObjName(Abc_NtkCo(pNtkNew, i))) )
            return 0;
    return 1;
}